

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseExtendedQualifier(State *state)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  bool bVar6;
  bool append;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar6 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar6) {
    state_local._7_1_ = false;
  }
  else {
    iVar2 = ((guard.state_)->parse_state).mangled_idx;
    iVar3 = ((guard.state_)->parse_state).out_cur_idx;
    iVar4 = ((guard.state_)->parse_state).prev_name_idx;
    uVar5 = *(undefined4 *)&((guard.state_)->parse_state).field_0xc;
    bVar6 = ParseOneCharToken(guard.state_,'U');
    if (bVar6) {
      uVar1 = *(undefined4 *)&((guard.state_)->parse_state).field_0xc;
      DisableAppend(guard.state_);
      bVar6 = ParseSourceName(guard.state_);
      if (bVar6) {
        bVar6 = ParseTemplateArgs(guard.state_);
        Optional(bVar6);
        RestoreAppend(guard.state_,SUB41((uint)uVar1 >> 0x1f,0));
        state_local._7_1_ = true;
      }
      else {
        ((guard.state_)->parse_state).mangled_idx = iVar2;
        ((guard.state_)->parse_state).out_cur_idx = iVar3;
        ((guard.state_)->parse_state).prev_name_idx = iVar4;
        *(undefined4 *)&((guard.state_)->parse_state).field_0xc = uVar5;
        state_local._7_1_ = false;
      }
    }
    else {
      state_local._7_1_ = false;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseExtendedQualifier(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  if (!ParseOneCharToken(state, 'U')) return false;

  bool append = state->parse_state.append;
  DisableAppend(state);
  if (!ParseSourceName(state)) {
    state->parse_state = copy;
    return false;
  }
  Optional(ParseTemplateArgs(state));
  RestoreAppend(state, append);
  return true;
}